

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void transall(int p,int q,int P,int Q,double *old,double *new1)

{
  int local_2c;
  int N;
  double *new1_local;
  double *old_local;
  int Q_local;
  int P_local;
  int q_local;
  int p_local;
  
  local_2c = 0;
  if (p != 0) {
    artrans(p,old,new1);
    local_2c = p;
  }
  if (q != 0) {
    artrans(q,old + local_2c,new1 + local_2c);
    local_2c = local_2c + q;
  }
  if (P != 0) {
    artrans(P,old + local_2c,new1 + local_2c);
    local_2c = local_2c + P;
  }
  if (Q != 0) {
    artrans(Q,old + local_2c,new1 + local_2c);
  }
  return;
}

Assistant:

void transall(int p,int q, int P, int Q, double *old, double *new1) {
	int N;

	N = 0;

	if (p != 0) {
		artrans(p, old, new1);
		N = N + p;
	}

	if (q != 0) {
		artrans(q, old + N, new1 + N);
		N = N + q;
	}

	if(P != 0) {
		artrans(P, old + N, new1 + N);
		N = N + P;
	}

	if (Q != 0) {
		artrans(Q, old + N, new1 + N);
	}
}